

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O0

bool __thiscall
Gudhi::persistence_matrix::
Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>*,8ul,void,void>>
::
_add<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>*,8ul,void,void>>>
          (Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>*,8ul,void,void>>
           *this,Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
                 *column)

{
  type_conflict1 tVar1;
  bool bVar2;
  ID_index rowIndex;
  size_type sVar3;
  size_t sVar4;
  anon_class_16_2_26534583 local_f8;
  anon_class_8_1_d68037b6 local_e8;
  anon_class_1_0_00000001 local_d9;
  anon_class_16_2_90bf7f7f local_d8;
  anon_class_8_1_d68037b6 local_c8;
  byte local_bd;
  bool pivotIsZeroed;
  undefined1 local_b0 [8];
  Column_support newColumn;
  Entry *entry;
  const_iterator __end0;
  const_iterator __begin0;
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
  *__range4;
  undefined1 local_30 [4];
  Index i;
  undefined1 local_28 [16];
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
  *column_local;
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
  *this_local;
  
  local_28._8_8_ = column;
  column_local = (Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
                  *)this;
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
  ::begin((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
           *)local_28);
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
  ::end((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
         *)local_30);
  tVar1 = boost::iterators::operator==
                    ((iterator_facade<boost::iterators::indirect_iterator<boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_**,_true>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>,_boost::iterators::random_access_traversal_tag,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_&,_long>
                      *)local_28,
                     (iterator_facade<boost::iterators::indirect_iterator<boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_**,_true>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>,_boost::iterators::random_access_traversal_tag,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_&,_long>
                      *)local_30);
  if (tVar1) {
    this_local._7_1_ = 0;
  }
  else {
    bVar2 = boost::container::
            vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
            ::empty((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
                     *)(this + 0x20));
    if (bVar2) {
      sVar4 = Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
              ::size((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
                      *)local_28._8_8_);
      boost::container::
      vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
      ::resize((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
                *)(this + 0x20),sVar4);
      __range4._4_4_ = 0;
      Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
      ::begin((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
               *)&__end0);
      Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
      ::end((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
             *)&entry);
      while( true ) {
        tVar1 = boost::iterators::operator!=
                          ((iterator_facade<boost::iterators::indirect_iterator<boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_**,_true>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>,_boost::iterators::random_access_traversal_tag,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_&,_long>
                            *)&__end0,
                           (iterator_facade<boost::iterators::indirect_iterator<boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_**,_true>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>,_boost::iterators::random_access_traversal_tag,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_&,_long>
                            *)&entry);
        if (!tVar1) break;
        newColumn.super_type.m_rest_of_storage[6] =
             (aligned_struct_wrapper<8UL,_8UL>)
             boost::iterators::detail::
             iterator_facade_base<boost::iterators::indirect_iterator<boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_**,_true>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>,_boost::iterators::random_access_traversal_tag,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_&,_long,_false,_false>
             ::operator*((iterator_facade_base<boost::iterators::indirect_iterator<boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_**,_true>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>,_boost::iterators::random_access_traversal_tag,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_&,_long,_false,_false>
                          *)&__end0);
        rowIndex = Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>
                   ::get_row_index((Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>
                                    *)newColumn.super_type.m_rest_of_storage[6]);
        Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
        ::_update_entry((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
                         *)this,rowIndex,__range4._4_4_);
        boost::iterators::detail::
        iterator_facade_base<boost::iterators::indirect_iterator<boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_**,_true>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>,_boost::iterators::random_access_traversal_tag,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_&,_long,_false,_false>
        ::operator++((iterator_facade_base<boost::iterators::indirect_iterator<boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_**,_true>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>,_boost::iterators::random_access_traversal_tag,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_&,_long,_false,_false>
                      *)&__end0);
        __range4._4_4_ = __range4._4_4_ + 1;
      }
      this_local._7_1_ = 1;
    }
    else {
      boost::container::
      small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>
      ::small_vector((small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>
                      *)local_b0);
      sVar3 = boost::container::
              vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
              ::size((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
                      *)(this + 0x20));
      sVar4 = Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
              ::size((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
                      *)local_28._8_8_);
      boost::container::
      vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
      ::reserve((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
                 *)local_b0,sVar3 + sVar4);
      local_f8.newColumn = (Column_support *)local_b0;
      local_f8.this =
           (Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
            *)this;
      local_e8.newColumn = local_f8.newColumn;
      local_d8.newColumn = local_f8.newColumn;
      local_d8.this =
           (Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
            *)this;
      local_c8.newColumn = local_f8.newColumn;
      local_bd = _generic_add_to_column<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>*,8ul,void,void>>,Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>*,8ul,void,void>>,Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,tru___x<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>**,false>&)_1_>
                           ((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
                             *)local_28._8_8_,
                            (Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
                             *)this,&local_c8,&local_d8,&local_d9,&local_e8,&local_f8);
      boost::container::
      small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>
      ::swap((small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>
              *)(this + 0x20),
             (small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>
              *)local_b0);
      this_local._7_1_ = local_bd & 1;
      boost::container::
      small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>
      ::~small_vector((small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>
                       *)local_b0);
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool Naive_vector_column<Master_matrix,Support>::_add(const Entry_range& column)
{
  if (column.begin() == column.end()) return false;
  if (column_.empty()) {  // chain should never enter here.
    column_.resize(column.size());
    Index i = 0;
    for (const Entry& entry : column) {
      if constexpr (Master_matrix::Option_list::is_z2) {
        _update_entry(entry.get_row_index(), i++);
      } else {
        _update_entry(entry.get_element(), entry.get_row_index(), i++);
      }
    }
    return true;
  }

  Column_support newColumn;
  newColumn.reserve(column_.size() + column.size());  // safe upper bound

  auto pivotIsZeroed = _generic_add_to_column(
      column,
      *this,
      [&](Entry* entryTarget) { newColumn.push_back(entryTarget); },
      [&](typename Entry_range::const_iterator& itSource,
          [[maybe_unused]] const typename Column_support::iterator& itTarget) {
        if constexpr (Master_matrix::Option_list::is_z2) {
          _insert_entry(itSource->get_row_index(), newColumn);
        } else {
          _insert_entry(itSource->get_element(), itSource->get_row_index(), newColumn);
        }
      },
      [&](Field_element& targetElement, typename Entry_range::const_iterator& itSource) {
        if constexpr (!Master_matrix::Option_list::is_z2)
          operators_->add_inplace(targetElement, itSource->get_element());
      },
      [&](Entry* entryTarget) { newColumn.push_back(entryTarget); },
      [&](typename Column_support::iterator& itTarget) {
        while (itTarget != column_.end()) {
          newColumn.push_back(*itTarget);
          itTarget++;
        }
      });

  column_.swap(newColumn);

  return pivotIsZeroed;
}